

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
async_read_at_least(connection<websocketpp::config::asio::transport_config> *this,size_t num_bytes,
                   char *buf,size_t len,read_handler *handler)

{
  bool bVar1;
  element_type *this_00;
  _Placeholder<2> *__args_3;
  wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
  *this_01;
  size_t in_RCX;
  ulong in_RSI;
  mutable_buffers_1 *in_RDI;
  wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
  *in_R8;
  stringstream s;
  void *in_stack_fffffffffffffcd0;
  function<void_(const_std::error_code_&,_unsigned_long)> *__args_1;
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
  *__args;
  connection<websocketpp::config::asio::transport_config> *in_stack_fffffffffffffce8;
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>
  *in_stack_fffffffffffffcf0;
  element_type *in_stack_fffffffffffffd08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd10;
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>
  *in_stack_fffffffffffffd40;
  handler_allocator *in_stack_fffffffffffffd48;
  string local_1e0 [48];
  stringstream local_1b0 [16];
  ostream local_1a0 [400];
  ulong local_10;
  
  local_10 = in_RSI;
  this_00 = std::
            __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2f632a);
  bVar1 = log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::static_test
                    (this_00,0x400);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    in_stack_fffffffffffffcf0 =
         (custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>
          *)std::operator<<(local_1a0,"asio async_read_at_least: ");
    std::ostream::operator<<(in_stack_fffffffffffffcf0,local_10);
    in_stack_fffffffffffffce8 =
         (connection<websocketpp::config::asio::transport_config> *)
         std::
         __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2f638a);
    std::__cxx11::stringstream::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *)
               in_stack_fffffffffffffce8,0x400,local_1e0,in_RCX);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  __args_3 = (_Placeholder<2> *)basic_socket::connection::get_socket((connection *)0x2f642e);
  ::asio::buffer(in_stack_fffffffffffffcd0,(size_t)__args_3);
  ::asio::transfer_at_least((size_t)__args_3);
  this_01 = (wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
             *)std::
               __shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2f647d);
  __args_1 = (function<void_(const_std::error_code_&,_unsigned_long)> *)(in_RDI + 0x14);
  __args = (shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
            *)&stack0xfffffffffffffd08;
  get_shared(in_stack_fffffffffffffce8);
  std::
  bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*)(std::function<void(std::error_code_const&,unsigned_long)>,std::error_code_const&,unsigned_long),std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((offset_in_connection<websocketpp::config::asio::transport_config>_to_subr *)
             in_stack_fffffffffffffce8,__args,__args_1,(_Placeholder<1> *)this_01,__args_3);
  make_custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,std::error_code_const&,unsigned_long)>>
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  ::asio::io_context::strand::
  wrap<websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,std::error_code_const&,unsigned_long)>>>
            (&in_R8->dispatcher_,in_stack_fffffffffffffcf0);
  ::asio::
  async_read<asio::basic_stream_socket<asio::ip::tcp>,asio::mutable_buffers_1,asio::detail::transfer_at_least_t,asio::detail::wrapped_handler<asio::io_context::strand,websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>>,std::function<void(std::error_code_const&,unsigned_long)>,std::_Placeholder<1>,std::_Placeholder<2>))(std::function<void(std::error_code_const&,unsigned_long)>,std::error_code_const&,unsigned_long)>>,asio::detail::is_continuation_if_running>>
            ((basic_stream_socket<asio::ip::tcp> *)in_stack_fffffffffffffd08,in_RDI,
             (transfer_at_least_t)in_stack_fffffffffffffd10._M_pi,in_R8,in_stack_fffffffffffffcf0);
  ::asio::detail::
  wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>
  ::~wrapped_handler(this_01);
  custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>
  ::~custom_alloc_handler
            ((custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>
              *)0x2f6559);
  std::
  _Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>
  ::~_Bind((_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>
            *)0x2f6563);
  std::
  shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
  ::~shared_ptr((shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>
                 *)0x2f656d);
  return;
}

Assistant:

void async_read_at_least(size_t num_bytes, char *buf, size_t len,
        read_handler handler)
    {
        if (m_alog->static_test(log::alevel::devel)) {
            std::stringstream s;
            s << "asio async_read_at_least: " << num_bytes;
            m_alog->write(log::alevel::devel,s.str());
        }

        // TODO: safety vs speed ?
        // maybe move into an if devel block
        /*if (num_bytes > len) {
            m_elog->write(log::elevel::devel,
                "asio async_read_at_least error::invalid_num_bytes");
            handler(make_error_code(transport::error::invalid_num_bytes),
                size_t(0));
            return;
        }*/

        if (config::enable_multithreading) {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                m_strand->wrap(make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );    
        }
        
    }